

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

ostream * wasm::DataFlow::dump(Graph *graph,ostream *o)

{
  pointer puVar1;
  ostream *poVar2;
  iterator iVar3;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  pointer puVar4;
  _Head_base<0UL,_wasm::DataFlow::Node_*,_false> local_40;
  char local_31;
  
  puVar4 = (graph->nodes).
           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (graph->nodes).
           super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"NODE ",5);
      poVar2 = std::ostream::_M_insert<void_const*>(o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      dump((puVar4->_M_t).
           super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
           .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl,o,0);
      local_40._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
           .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl;
      iVar3 = std::
              _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(graph->nodeParentMap)._M_h,&local_40._M_head_impl);
      if ((iVar3.
           super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (**(int **)((long)iVar3.
                           super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
                           ._M_cur + 0x10) == 9)) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"  and that is set to local ",0x1b);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  return o;
}

Assistant:

inline std::ostream& dump(Graph& graph, std::ostream& o) {
  for (auto& node : graph.nodes) {
    o << "NODE " << node.get() << ": ";
    dump(node.get(), o);
    if (auto* set = graph.getSet(node.get())) {
      o << "  and that is set to local " << set->index << '\n';
    }
  }
  return o;
}